

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::GenerateStringTest
          (Lowerer *this,RegOpnd *srcReg,Instr *insertInstr,LabelInstr *labelHelper,
          LabelInstr *continueLabel,bool generateObjectCheck)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IndirOpnd *compareSrc1;
  Opnd *compareSrc2;
  BranchInstr *branchInstr;
  OpCode branchOpCode;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  if (srcReg == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6e82,"(srcReg)","srcReg");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_32 = (srcReg->super_Opnd).m_valueType.field_0;
  bVar2 = ValueType::IsString((ValueType *)&local_32.field_0);
  if (!bVar2) {
    if (generateObjectCheck) {
      bVar2 = IR::Opnd::IsNotTaggedValue(&srcReg->super_Opnd);
      if (!bVar2) {
        LowererMD::GenerateObjectTest
                  (&this->m_lowererMD,&srcReg->super_Opnd,insertInstr,labelHelper,false);
      }
    }
    compareSrc1 = IR::IndirOpnd::New(srcReg,8,TyInt64,this->m_func,false);
    compareSrc2 = LoadLibraryValueOpnd(this,insertInstr,ValueStringTypeStatic);
    if (continueLabel == (LabelInstr *)0x0) {
      branchOpCode = BrNeq_A;
      continueLabel = labelHelper;
    }
    else {
      branchOpCode = BrEq_A;
    }
    branchInstr = InsertCompareBranch(this,&compareSrc1->super_Opnd,compareSrc2,branchOpCode,
                                      continueLabel,insertInstr,false);
    LowererMD::InsertObjectPoison(&srcReg->super_Opnd,branchInstr,insertInstr,false);
  }
  return;
}

Assistant:

void
Lowerer::GenerateStringTest(IR::RegOpnd *srcReg, IR::Instr *insertInstr, IR::LabelInstr *labelHelper, IR::LabelInstr * continueLabel, bool generateObjectCheck)
{
    Assert(srcReg);
    if (!srcReg->GetValueType().IsString())
    {
        if (generateObjectCheck && !srcReg->IsNotTaggedValue())
        {
            this->m_lowererMD.GenerateObjectTest(srcReg, insertInstr, labelHelper);
        }

        // CMP [regSrcStr + offset(type)] , static string type   -- check base string type
        // BrEq/BrNeq labelHelper.
        IR::IndirOpnd * src1 = IR::IndirOpnd::New(srcReg, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, m_func);
        IR::Opnd * src2 = this->LoadLibraryValueOpnd(insertInstr, LibraryValue::ValueStringTypeStatic);
        IR::BranchInstr* branchInstr = nullptr;
        if (continueLabel)
        {
            branchInstr = InsertCompareBranch(src1, src2, Js::OpCode::BrEq_A, continueLabel, insertInstr);
        }
        else
        {
            branchInstr = InsertCompareBranch(src1, src2, Js::OpCode::BrNeq_A, labelHelper, insertInstr);
        }
        InsertObjectPoison(srcReg, branchInstr, insertInstr, false);
    }
}